

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O3

void __thiscall Assimp::Q3BSPFileParser::getVertices(Q3BSPFileParser *this)

{
  Q3BSPModel *pQVar1;
  pointer pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  sQ3BSPVertex *psVar9;
  ulong uVar10;
  long lVar11;
  
  pQVar1 = this->m_pModel;
  if ((pQVar1->m_Vertices).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pQVar1->m_Vertices).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar11 = (long)(pQVar1->m_Lumps).
                   super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[10]->iOffset;
    uVar10 = 0;
    do {
      psVar9 = (sQ3BSPVertex *)operator_new(0x2c);
      pcVar2 = (this->m_Data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = *(undefined8 *)(pcVar2 + lVar11);
      uVar4 = *(undefined8 *)(pcVar2 + lVar11 + 8);
      uVar5 = *(undefined8 *)(pcVar2 + lVar11 + 0x10);
      uVar6 = *(undefined8 *)(pcVar2 + lVar11 + 0x10 + 8);
      uVar7 = *(undefined8 *)(pcVar2 + lVar11 + 0x1c);
      uVar8 = *(undefined8 *)(pcVar2 + lVar11 + 0x1c + 8);
      (psVar9->vPosition).x = (float)(int)uVar3;
      (psVar9->vPosition).y = (float)(int)((ulong)uVar3 >> 0x20);
      *(undefined8 *)&(psVar9->vPosition).z = uVar4;
      *(undefined8 *)&(psVar9->vTexCoord).y = uVar5;
      *(undefined8 *)&(psVar9->vLightmap).y = uVar6;
      (psVar9->vNormal).x = (float)(int)uVar7;
      (psVar9->vNormal).y = (float)(int)((ulong)uVar7 >> 0x20);
      *(undefined8 *)&(psVar9->vNormal).z = uVar8;
      lVar11 = lVar11 + 0x2c;
      (pQVar1->m_Vertices).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar10] = psVar9;
      uVar10 = uVar10 + 1;
      pQVar1 = this->m_pModel;
    } while (uVar10 < (ulong)((long)(pQVar1->m_Vertices).
                                    super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pQVar1->m_Vertices).
                                    super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void Q3BSPFileParser::getVertices()
{
    size_t Offset = m_pModel->m_Lumps[ kVertices ]->iOffset;
    for ( size_t idx = 0; idx < m_pModel->m_Vertices.size(); idx++ )
    {
        sQ3BSPVertex *pVertex = new sQ3BSPVertex;
        memcpy( pVertex, &m_Data[ Offset ], sizeof( sQ3BSPVertex ) );
        Offset += sizeof( sQ3BSPVertex );
        m_pModel->m_Vertices[ idx ] = pVertex;
    }
}